

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O1

void __thiscall cmPolicies::PolicyMap::Set(PolicyMap *this,PolicyID id,PolicyStatus status)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  _WordT _Var4;
  
  iVar1 = id * 3;
  uVar2 = (ulong)(long)iVar1 >> 6;
  uVar3 = 1L << ((byte)iVar1 & 0x3f);
  if (status == OLD) {
    _Var4 = uVar3 | (this->Status).super__Base_bitset<7UL>._M_w[uVar2];
  }
  else {
    _Var4 = ~uVar3 & (this->Status).super__Base_bitset<7UL>._M_w[uVar2];
  }
  (this->Status).super__Base_bitset<7UL>._M_w[uVar2] = _Var4;
  uVar2 = (ulong)(long)(iVar1 + 1) >> 6;
  uVar3 = 1L << ((byte)(iVar1 + 1) & 0x3f);
  if (status == WARN) {
    _Var4 = uVar3 | (this->Status).super__Base_bitset<7UL>._M_w[uVar2];
  }
  else {
    _Var4 = ~uVar3 & (this->Status).super__Base_bitset<7UL>._M_w[uVar2];
  }
  (this->Status).super__Base_bitset<7UL>._M_w[uVar2] = _Var4;
  uVar2 = (ulong)(long)(iVar1 + 2) >> 6;
  uVar3 = 1L << ((byte)(iVar1 + 2) & 0x3f);
  if (status == NEW) {
    uVar3 = uVar3 | (this->Status).super__Base_bitset<7UL>._M_w[uVar2];
  }
  else {
    uVar3 = ~uVar3 & (this->Status).super__Base_bitset<7UL>._M_w[uVar2];
  }
  (this->Status).super__Base_bitset<7UL>._M_w[uVar2] = uVar3;
  return;
}

Assistant:

void cmPolicies::PolicyMap::Set(cmPolicies::PolicyID id,
                                cmPolicies::PolicyStatus status)
{
  this->Status[(POLICY_STATUS_COUNT * id) + OLD] = (status == OLD);
  this->Status[(POLICY_STATUS_COUNT * id) + WARN] = (status == WARN);
  this->Status[(POLICY_STATUS_COUNT * id) + NEW] = (status == NEW);
}